

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

QString * __thiscall
CPP::WriteInitialization::disableSorting
          (QString *__return_storage_ptr__,WriteInitialization *this,DomWidget *w,QString *varName)

{
  QArrayData *pQVar1;
  long lVar2;
  Driver *this_00;
  char16_t *pcVar3;
  qsizetype qVar4;
  Language LVar5;
  QTextStream *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QString local_88;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = &((w->m_item).d.d)->super_QArrayData;
  lVar2 = (w->m_item).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,0x10);
    }
  }
  if (lVar2 != 0) {
    this_00 = this->m_driver;
    QVar7.m_data = (storage_type *)0x10;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar7);
    local_68.d.d = local_48.d.d;
    local_68.d.ptr = local_48.d.ptr;
    local_68.d.size = local_48.d.size;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    Driver::unique(&local_48,this_00,&local_68,&local_88);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar1;
    local_48.d.ptr = pcVar3;
    local_48.d.size = qVar4;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = &this->m_refreshOut;
    QTextStream::operator<<(pQVar6,"\n");
    QTextStream::operator<<(pQVar6,&this->m_indent);
    LVar5 = language::language();
    if (LVar5 == Cpp) {
      QTextStream::operator<<(pQVar6,"const bool ");
    }
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,__return_storage_ptr__);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," = ");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,varName);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&language::derefPointer);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"isSortingEnabled()");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&language::eol);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&this->m_indent);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,varName);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&language::derefPointer);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"setSortingEnabled(");
    language::boolValue(&local_48,false);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,&local_48);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,')');
    QTextStream::operator<<(pQVar6,(QString *)&language::eol);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString WriteInitialization::disableSorting(DomWidget *w, const QString &varName)
{
    // turn off sortingEnabled to force programmatic item order (setItem())
    QString tempName;
    if (!w->elementItem().isEmpty()) {
        tempName = m_driver->unique("__sortingEnabled"_L1);
        m_refreshOut << "\n";
        m_refreshOut << m_indent;
        if (language::language() == Language::Cpp)
            m_refreshOut << "const bool ";
        m_refreshOut << tempName << " = " << varName << language::derefPointer
            << "isSortingEnabled()" << language::eol
            << m_indent << varName << language::derefPointer
            << "setSortingEnabled(" << language::boolValue(false) << ')' << language::eol;
    }
    return tempName;
}